

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_FindUniqueTid
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int val;
  VMValue *pVVar1;
  int local_40;
  int u;
  int limit;
  int start;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xcfc,
                    "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0);
    u = (pVVar1->field_0).i;
  }
  else {
    if ((param->field_0).field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xcfc,
                    "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    u = (param->field_0).i;
  }
  if (numparam < 2) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xcfd,
                    "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    local_40 = (pVVar1->field_0).i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xcfd,
                    "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = param[1].field_0.i;
  }
  val = P_FindUniqueTID(u,local_40);
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xcfe,
                    "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetInt(ret,val);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, FindUniqueTid)
{
	PARAM_PROLOGUE;
	PARAM_INT_DEF(start);
	PARAM_INT_DEF(limit);
	ACTION_RETURN_INT(P_FindUniqueTID(start, limit));
}